

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall Compiler::instructionToBinary(Compiler *this,Instruction *ins)

{
  int count;
  Operation OVar1;
  iterator iVar2;
  pair<int,_int> pVar3;
  Error *this_00;
  u4 param;
  u2 param1;
  string local_38;
  
  param = Instruction::getOpr(ins);
  iVar2 = std::
          _Rb_tree<Operation,_std::pair<const_Operation,_char_*>,_std::_Select1st<std::pair<const_Operation,_char_*>_>,_std::less<Operation>,_std::allocator<std::pair<const_Operation,_char_*>_>_>
          ::find(&ITCTable._M_t,&param);
  if ((_Rb_tree_header *)iVar2._M_node == &ITCTable._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unvalid operation type",(allocator<char> *)&param);
    Error::Error(this_00,&local_38);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  std::ostream::write((char *)this->_wtr,(long)iVar2._M_node[1]._M_parent);
  OVar1 = Instruction::getOpr(ins);
  switch(OVar1) {
  case ipush:
    pVar3 = Instruction::getParam(ins);
    param = pVar3.first;
    break;
  default:
    goto switchD_001153cb_caseD_1;
  case loada:
    pVar3 = Instruction::getParam(ins);
    param1 = (u2)pVar3.first;
    writeNBytes(this,&param1,2);
    pVar3 = Instruction::getParam(ins);
    param = pVar3.second;
    break;
  case loadc:
  case call:
  case je:
  case jne:
  case jg:
  case jge:
  case jl:
  case jle:
  case jmp:
    pVar3 = Instruction::getParam(ins);
    param = CONCAT22(param._2_2_,(short)pVar3.first);
    count = 2;
    goto LAB_001153df;
  }
  count = 4;
LAB_001153df:
  writeNBytes(this,&param,count);
switchD_001153cb_caseD_1:
  return;
}

Assistant:

void Compiler::instructionToBinary(Instruction& ins) {
	if (auto it = ITCTable.find(ins.getOpr()); it != ITCTable.end()) {
		_wtr.write(it->second, 1);
	}
	else {
		throw Error("Unvalid operation type");
	}
	switch (ins.getOpr())
	{
	case Operation::ipush: {
		u4 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::loada: {
		u2 param1 = ins.getParam().first;
		writeNBytes(&param1, sizeof param1);
		u4 param2 = ins.getParam().second;
		writeNBytes(&param2, sizeof param2);
		break;
	}
	case Operation::loadc: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::call: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jmp: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::je: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jne: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jl: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jle: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jg: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jge: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	default:
		break;
	}
}